

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  undefined8 in_RAX;
  size_t sVar2;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  printOpenHeader(this,_name);
  poVar1 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam000000000018cfb0 = 0x2e2e2e2e2e2e2e;
    uRam000000000018cfb7._0_1_ = '.';
    uRam000000000018cfb7._1_1_ = '.';
    uRam000000000018cfb7._2_1_ = '.';
    uRam000000000018cfb7._3_1_ = '.';
    uRam000000000018cfb7._4_1_ = '.';
    uRam000000000018cfb7._5_1_ = '.';
    uRam000000000018cfb7._6_1_ = '.';
    uRam000000000018cfb7._7_1_ = '.';
    DAT_0018cfa0 = '.';
    DAT_0018cfa0_1._0_1_ = '.';
    DAT_0018cfa0_1._1_1_ = '.';
    DAT_0018cfa0_1._2_1_ = '.';
    DAT_0018cfa0_1._3_1_ = '.';
    DAT_0018cfa0_1._4_1_ = '.';
    DAT_0018cfa0_1._5_1_ = '.';
    DAT_0018cfa0_1._6_1_ = '.';
    uRam000000000018cfa8 = 0x2e2e2e2e2e2e2e;
    DAT_0018cfaf = 0x2e;
    DAT_0018cf90 = '.';
    DAT_0018cf90_1._0_1_ = '.';
    DAT_0018cf90_1._1_1_ = '.';
    DAT_0018cf90_1._2_1_ = '.';
    DAT_0018cf90_1._3_1_ = '.';
    DAT_0018cf90_1._4_1_ = '.';
    DAT_0018cf90_1._5_1_ = '.';
    DAT_0018cf90_1._6_1_ = '.';
    uRam000000000018cf98._0_1_ = '.';
    uRam000000000018cf98._1_1_ = '.';
    uRam000000000018cf98._2_1_ = '.';
    uRam000000000018cf98._3_1_ = '.';
    uRam000000000018cf98._4_1_ = '.';
    uRam000000000018cf98._5_1_ = '.';
    uRam000000000018cf98._6_1_ = '.';
    uRam000000000018cf98._7_1_ = '.';
    DAT_0018cf80 = '.';
    DAT_0018cf80_1._0_1_ = '.';
    DAT_0018cf80_1._1_1_ = '.';
    DAT_0018cf80_1._2_1_ = '.';
    DAT_0018cf80_1._3_1_ = '.';
    DAT_0018cf80_1._4_1_ = '.';
    DAT_0018cf80_1._5_1_ = '.';
    DAT_0018cf80_1._6_1_ = '.';
    uRam000000000018cf88._0_1_ = '.';
    uRam000000000018cf88._1_1_ = '.';
    uRam000000000018cf88._2_1_ = '.';
    uRam000000000018cf88._3_1_ = '.';
    uRam000000000018cf88._4_1_ = '.';
    uRam000000000018cf88._5_1_ = '.';
    uRam000000000018cf88._6_1_ = '.';
    uRam000000000018cf88._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam000000000018cf78._0_1_ = '.';
    uRam000000000018cf78._1_1_ = '.';
    uRam000000000018cf78._2_1_ = '.';
    uRam000000000018cf78._3_1_ = '.';
    uRam000000000018cf78._4_1_ = '.';
    uRam000000000018cf78._5_1_ = '.';
    uRam000000000018cf78._6_1_ = '.';
    uRam000000000018cf78._7_1_ = '.';
    DAT_0018cfbf = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)46>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)46>()::line,sVar2)
  ;
  uStack_18 = CONCAT17(10,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 7),1);
  return;
}

Assistant:

void ConsoleReporter::printClosedHeader(std::string const& _name) {
    printOpenHeader(_name);
    stream << getLineOfChars<'.'>() << '\n';
}